

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::replace_extension(path *this,path *replacement)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  path *ppVar5;
  path local_38;
  path *local_18;
  path *replacement_local;
  path *this_local;
  
  local_18 = replacement;
  replacement_local = this;
  bVar1 = has_extension(this);
  if (bVar1) {
    lVar2 = std::__cxx11::string::size();
    extension(&local_38,this);
    lVar3 = std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)this,lVar2 - lVar3);
    ~path(&local_38);
  }
  bVar1 = empty(local_18);
  if ((!bVar1) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar4 != '.')) {
    std::__cxx11::string::operator+=((string *)this,'.');
  }
  ppVar5 = concat<ghc::filesystem::path>(this,local_18);
  return ppVar5;
}

Assistant:

GHC_INLINE path& path::replace_extension(const path& replacement)
{
    if (has_extension()) {
        _path.erase(_path.size() - extension()._path.size());
    }
    if (!replacement.empty() && replacement._path[0] != '.') {
        _path += '.';
    }
    return concat(replacement);
}